

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error IsMacResource(FT_Library library,FT_Stream stream,FT_Long resource_offset,
                      FT_Long face_index,FT_Face_conflict *aface)

{
  FT_Memory pFVar1;
  void *pos;
  FT_Stream pFVar2;
  FT_UShort FVar3;
  FT_Error FVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  FT_ULong FVar8;
  FT_Byte *pFVar9;
  int *buffer;
  FT_ULong count_00;
  ulong uVar10;
  ulong uVar11;
  FT_Parameter *params;
  char *driver_name;
  FT_Face_conflict *aface_00;
  FT_Long FVar12;
  ulong uVar13;
  FT_Error local_ac;
  FT_Memory local_a8;
  FT_Byte *local_a0;
  FT_Library local_98;
  long local_90;
  uint local_84;
  ulong local_80;
  FT_ULong local_78;
  FT_Face_conflict *local_70;
  FT_Stream local_68;
  FT_Long count;
  FT_Memory local_58;
  FT_Memory local_50;
  long local_48;
  FT_Long rdata_pos;
  FT_Long map_offset;
  
  pFVar1 = library->memory;
  FVar4 = FT_Raccess_Get_HeaderInfo(library,stream,resource_offset,&map_offset,&rdata_pos);
  if (FVar4 != 0) {
    return FVar4;
  }
  local_70 = aface;
  local_50 = pFVar1;
  FVar4 = FT_Raccess_Get_DataOffsets
                    (library,stream,map_offset,rdata_pos,0x504f5354,'\x01',(FT_Long **)&local_58,
                     &count);
  local_98 = library;
  if (FVar4 == 0) {
    local_ac = 1;
    local_68 = stream;
    if (face_index + 1U < 2) {
      lVar7 = 0;
      FVar12 = count;
      if (count < 1) {
        FVar12 = lVar7;
      }
      pFVar1 = library->memory;
      uVar13 = 0;
      local_a8 = local_58;
      for (; pFVar2 = local_68, FVar12 != lVar7; lVar7 = lVar7 + 1) {
        FVar4 = FT_Stream_Seek(local_68,(FT_ULong)(&local_a8->user)[lVar7]);
        local_58 = local_a8;
        local_ac = FVar4;
        if ((FVar4 != 0) ||
           (FVar8 = FT_Stream_ReadULong(pFVar2,&local_ac), local_58 = local_a8, FVar4 = local_ac,
           local_ac != 0)) goto LAB_00138ca2;
        if ((0xffffff < FVar8) || (0xffffff - FVar8 < uVar13 + 6)) {
          FVar4 = 9;
          goto LAB_00138ca2;
        }
        uVar13 = uVar13 + 6 + FVar8;
      }
      if (uVar13 < 4) {
        FVar4 = 10;
        local_58 = local_a8;
      }
      else {
        local_48 = FVar12;
        pFVar9 = (FT_Byte *)ft_mem_alloc(pFVar1,uVar13 + 2,&local_ac);
        pFVar2 = local_68;
        local_58 = local_a8;
        FVar4 = local_ac;
        if (local_ac == 0) {
          pFVar9[0] = 0x80;
          pFVar9[1] = '\x01';
          pFVar9[2] = '\0';
          pFVar9[3] = '\0';
          pFVar9[4] = '\0';
          pFVar9[5] = '\0';
          local_90 = 2;
          uVar10 = 6;
          local_84 = 1;
          local_78 = 0;
          local_a0 = pFVar9;
          local_80 = uVar13 + 2;
          for (lVar7 = 0; local_48 != lVar7; lVar7 = lVar7 + 1) {
            local_ac = FT_Stream_Seek(pFVar2,(FT_ULong)(&local_a8->user)[lVar7]);
            if ((((local_ac != 0) || (FVar8 = FT_Stream_ReadULong(pFVar2,&local_ac), local_ac != 0))
                || (0x7fffffff < FVar8)) ||
               (FVar3 = FT_Stream_ReadUShort(pFVar2,&local_ac), local_ac != 0)) goto LAB_00138f3f;
            local_ac = 10;
            if (0xff < FVar3) {
              uVar6 = (uint)(FVar3 >> 8);
              count_00 = 0;
              if (1 < FVar8) {
                count_00 = FVar8 - 2;
              }
              if (local_84 == uVar6) {
                uVar11 = uVar10;
                local_78 = local_78 + count_00;
              }
              else {
                if (local_80 < local_90 + 3U) goto LAB_00138f3f;
                *(int *)(local_a0 + local_90) = (int)local_78;
                if (uVar6 == 5) break;
                uVar11 = uVar10 + 6;
                if (local_80 < uVar11) goto LAB_00138f3f;
                local_a0[uVar10] = 0x80;
                local_a0[uVar10 + 1] = (FT_Byte)(FVar3 >> 8);
                pFVar9 = local_a0 + uVar10 + 2;
                pFVar9[0] = '\0';
                pFVar9[1] = '\0';
                pFVar9[2] = '\0';
                pFVar9[3] = '\0';
                local_90 = uVar10 + 2;
                local_84 = uVar6;
                local_78 = count_00;
              }
              if (((uVar13 < uVar11) || (uVar10 = count_00 + uVar11, uVar13 < uVar10)) ||
                 (local_ac = FT_Stream_Read(pFVar2,local_a0 + uVar11,count_00), local_ac != 0))
              goto LAB_00138f3f;
            }
          }
          if ((local_80 < uVar10 + 2) ||
             ((local_a0 + uVar10)[0] = 0x80, (local_a0 + uVar10)[1] = '\x03',
             local_80 < local_90 + 3U)) {
LAB_00138f3f:
            (*pFVar1->free)(pFVar1,local_a0);
            FVar4 = 1;
            local_58 = local_a8;
          }
          else {
            *(int *)(local_a0 + local_90) = (int)local_78;
            FVar4 = open_face_from_buffer(local_98,local_a0,uVar10 + 2,0,"type1",local_70);
            local_58 = local_a8;
          }
        }
      }
    }
    else {
      FVar4 = 1;
    }
    if (local_58 != (FT_Memory)0x0) {
LAB_00138ca2:
      (*local_50->free)(local_50,local_58);
    }
    if (FVar4 != 0) {
      return FVar4;
    }
    count = 1;
  }
  else {
    params = (FT_Parameter *)0x73666e74;
    aface_00 = (FT_Face_conflict *)0x0;
    FVar4 = FT_Raccess_Get_DataOffsets
                      (library,stream,map_offset,rdata_pos,0x73666e74,'\0',(FT_Long **)&local_58,
                       &count);
    if (FVar4 != 0) {
      return FVar4;
    }
    uVar13 = face_index % count >> 0x3f ^ face_index % count;
    if ((long)uVar13 < count) {
      pFVar1 = library->memory;
      local_68 = (FT_Stream)local_58;
      pos = (&local_58->user)[uVar13];
      iVar5 = FT_Stream_Seek(stream,(FT_ULong)pos);
      local_58 = (FT_Memory)local_68;
      local_ac = iVar5;
      if ((iVar5 == 0) &&
         (local_a8 = pFVar1, FVar8 = FT_Stream_ReadULong(stream,&local_ac),
         local_58 = (FT_Memory)local_68, iVar5 = local_ac, local_ac == 0)) {
        if (FVar8 == 0) {
          iVar5 = 1;
        }
        else if (FVar8 < 0x1000000) {
          FVar4 = open_face_PS_from_sfnt_stream
                            (local_98,stream,uVar13,(FT_Int)local_70,params,aface_00);
          if (FVar4 == 0) {
            iVar5 = 0;
            local_58 = (FT_Memory)local_68;
          }
          else {
            iVar5 = FT_Stream_Seek(stream,(long)pos + 4);
            local_58 = (FT_Memory)local_68;
            local_ac = iVar5;
            if ((iVar5 == 0) &&
               (buffer = (int *)ft_mem_alloc(local_a8,FVar8,&local_ac),
               local_58 = (FT_Memory)local_68, iVar5 = local_ac, local_ac == 0)) {
              iVar5 = FT_Stream_Read(stream,(FT_Byte *)buffer,FVar8);
              if (iVar5 == 0) {
                if (FVar8 < 5) {
                  driver_name = "truetype";
                }
                else {
                  driver_name = "truetype";
                  if (*buffer == 0x4f54544f) {
                    driver_name = "cff";
                  }
                }
                iVar5 = open_face_from_buffer
                                  (local_98,(FT_Byte *)buffer,FVar8,0,driver_name,local_70);
                local_58 = (FT_Memory)local_68;
              }
              else {
                local_58 = (FT_Memory)local_68;
                if (buffer != (int *)0x0) {
                  (*local_a8->free)(local_a8,buffer);
                  local_58 = (FT_Memory)local_68;
                }
              }
            }
          }
        }
        else {
          iVar5 = 9;
        }
      }
    }
    else {
      iVar5 = 1;
      if (local_58 == (FT_Memory)0x0) {
        return 1;
      }
    }
    (*local_50->free)(local_50,local_58);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  (*local_70)->num_faces = count;
  return 0;
}

Assistant:

static FT_Error
  IsMacResource( FT_Library  library,
                 FT_Stream   stream,
                 FT_Long     resource_offset,
                 FT_Long     face_index,
                 FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Error   error;
    FT_Long    map_offset, rdata_pos;
    FT_Long    *data_offsets;
    FT_Long    count;


    error = FT_Raccess_Get_HeaderInfo( library, stream, resource_offset,
                                       &map_offset, &rdata_pos );
    if ( error )
      return error;

    /* POST resources must be sorted to concatenate properly */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_POST, TRUE,
                                        &data_offsets, &count );
    if ( !error )
    {
      error = Mac_Read_POST_Resource( library, stream, data_offsets, count,
                                      face_index, aface );
      FT_FREE( data_offsets );
      /* POST exists in an LWFN providing a single face */
      if ( !error )
        (*aface)->num_faces = 1;
      return error;
    }

    /* sfnt resources should not be sorted to preserve the face order by
       QuickDraw API */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_sfnt, FALSE,
                                        &data_offsets, &count );
    if ( !error )
    {
      FT_Long  face_index_internal = face_index % count;


      error = Mac_Read_sfnt_Resource( library, stream, data_offsets, count,
                                      face_index_internal, aface );
      FT_FREE( data_offsets );
      if ( !error )
        (*aface)->num_faces = count;
    }

    return error;
  }